

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::BasicReporter::NoAssertionsInTestCase(BasicReporter *this,string *testName)

{
  ostream *poVar1;
  Colour colour;
  
  startSpansLazily(this);
  Colour::Colour(&colour,BrightRed);
  poVar1 = std::operator<<((this->m_config).m_stream,"\nNo assertions in test case, \'");
  poVar1 = std::operator<<(poVar1,(string *)testName);
  poVar1 = std::operator<<(poVar1,"\'\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  Colour::~Colour(&colour);
  return;
}

Assistant:

virtual void NoAssertionsInTestCase( const std::string& testName ) {
            startSpansLazily();
            Colour colour( Colour::ResultError );
            m_config.stream() << "\nNo assertions in test case, '" << testName << "'\n" << std::endl;
        }